

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ConvertComplexPass.h
# Opt level: O2

Expression * __thiscall
soul::ConvertComplexPass::ConvertComplexRemapTypes::getRemappedType
          (ConvertComplexRemapTypes *this,Context *context,bool is32Bit,size_t vectorSize,
          size_t arraySize,bool isReference,bool isConst)

{
  ConcreteType *pCVar1;
  Type complexType;
  Type local_50;
  Type local_38;
  
  getComplexType(&local_38,this,context,is32Bit,vectorSize);
  if (arraySize != 0) {
    Type::createArray(&local_50,&local_38,arraySize);
    Type::operator=(&local_38,&local_50);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_50.structure);
  }
  if (isReference) {
    Type::createReference(&local_50,&local_38);
    Type::operator=(&local_38,&local_50);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_50.structure);
  }
  if (isConst) {
    Type::createConst(&local_50,&local_38);
    Type::operator=(&local_38,&local_50);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_50.structure);
  }
  pCVar1 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context&,soul::Type&>
                     (&this->allocator->pool,context,&local_38);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_38.structure);
  return &pCVar1->super_Expression;
}

Assistant:

AST::Expression& getRemappedType (AST::Context& context, bool is32Bit, size_t vectorSize, size_t arraySize, bool isReference, bool isConst)
        {
            auto complexType = getComplexType (context, is32Bit, vectorSize);

            if (arraySize != 0)
                complexType = complexType.createArray (arraySize);

            if (isReference)
                complexType = complexType.createReference();

            if (isConst)
                complexType = complexType.createConst();

            return allocator.allocate<AST::ConcreteType> (context, complexType);
        }